

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubModel.cpp
# Opt level: O0

void __thiscall
iDynTree::SubModelDecomposition::setNrOfSubModels(SubModelDecomposition *this,size_t nrOfSubModels)

{
  size_type sVar1;
  reference ppTVar2;
  size_type sVar3;
  value_type pTVar4;
  vector<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_> *in_RDI;
  size_t smIdx_1;
  size_t smIdx;
  Traversal *in_stack_ffffffffffffffb0;
  Traversal *in_stack_ffffffffffffffd0;
  undefined8 local_20;
  undefined8 local_18;
  
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>::size(in_RDI)
    ;
    if (sVar1 <= local_18) break;
    ppTVar2 = std::vector<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>::operator[]
                        (in_RDI,local_18);
    pTVar4 = *ppTVar2;
    if (pTVar4 != (value_type)0x0) {
      Traversal::~Traversal(in_stack_ffffffffffffffb0);
      operator_delete(pTVar4,0x60);
    }
    ppTVar2 = std::vector<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>::operator[]
                        (in_RDI,local_18);
    *ppTVar2 = (value_type)0x0;
    local_18 = local_18 + 1;
  }
  std::vector<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>::resize
            ((vector<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_> *)
             in_stack_ffffffffffffffd0,(size_type)in_RDI);
  local_20 = 0;
  while( true ) {
    sVar1 = local_20;
    sVar3 = std::vector<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>::size(in_RDI)
    ;
    if (sVar3 <= sVar1) break;
    pTVar4 = (value_type)operator_new(0x60);
    Traversal::Traversal(in_stack_ffffffffffffffd0);
    ppTVar2 = std::vector<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>::operator[]
                        (in_RDI,local_20);
    *ppTVar2 = pTVar4;
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void SubModelDecomposition::setNrOfSubModels(const size_t nrOfSubModels)
{
    for(size_t smIdx=0; smIdx < subModelTraversals.size(); smIdx++ )
    {
        delete subModelTraversals[smIdx];
        subModelTraversals[smIdx] = 0;
    }

    subModelTraversals.resize(nrOfSubModels);

    for(size_t smIdx=0; smIdx < subModelTraversals.size(); smIdx++ )
    {
        subModelTraversals[smIdx] = new Traversal();
    }
}